

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

string_t * __thiscall
el::base::DefaultLogBuilder::build_abi_cxx11_
          (string_t *__return_storage_ptr__,DefaultLogBuilder *this,LogMessage *logMessage,
          bool appendNewLine)

{
  string_t *psVar1;
  Level LVar2;
  TypedConfigurations *this_00;
  pointer pcVar3;
  pointer pcVar4;
  LogFormat *pLVar5;
  iterator iVar6;
  size_type *psVar7;
  SubsecondPrecision *format;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  undefined8 uVar11;
  undefined7 in_register_00000009;
  char *buf;
  key_type *__k;
  SubsecondPrecision *in_R9;
  undefined8 *puVar12;
  timeval tval;
  string fs;
  string_t wcsFormatSpecifier;
  timeval currTime;
  char buff [110];
  undefined1 local_128 [32];
  LogMessage *local_108;
  undefined1 local_100 [36];
  undefined4 local_dc;
  key_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  LogMessage *local_b0;
  ulong local_a8 [11];
  undefined6 uStack_50;
  undefined2 local_4a;
  undefined6 uStack_48;
  undefined8 uStack_42;
  char local_3a [10];
  
  local_dc = (undefined4)CONCAT71(in_register_00000009,appendNewLine);
  this_00 = logMessage->m_logger->m_typedConfigurations;
  LVar2 = logMessage->m_level;
  local_108 = logMessage;
  (*(this_00->super_ThreadSafe)._vptr_ThreadSafe[2])(this_00);
  pLVar5 = TypedConfigurations::unsafeGetConfigByRef<el::base::LogFormat>
                     (this_00,LVar2,&this_00->m_logFormatMap,"logFormat");
  local_b8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_b8;
  pcVar3 = (pLVar5->m_format)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (pLVar5->m_format)._M_string_length);
  uStack_48 = 0;
  uStack_42 = 0;
  local_a8[10] = 0;
  uStack_50 = 0;
  local_4a = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  if ((pLVar5->m_flags & 0x800) != 0) {
    local_128._0_8_ = (string_t *)(local_128 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"%app","");
    utils::Str::replaceFirstWithEscape
              (__return_storage_ptr__,(string_t *)local_128,
               (string_t *)&local_108->m_logger->m_parentApplicationName);
    if ((string_t *)local_128._0_8_ != (string_t *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_);
    }
  }
  if ((pLVar5->m_flags & 0x1000) != 0) {
    local_128._0_8_ = (string_t *)(local_128 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"%thread","");
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    __k = &local_d8;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    iVar6 = utils::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(elStorage + 0x120),__k);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      psVar7 = &local_d8._M_string_length;
    }
    else {
      __k = (key_type *)
            ((long)iVar6.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                   ._M_cur + 0x28);
      psVar7 = (size_type *)
               ((long)iVar6.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      ._M_cur + 0x30);
    }
    local_100._0_8_ = local_100 + 0x10;
    pcVar4 = (__k->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)local_100,pcVar4,pcVar4 + *psVar7);
    utils::Str::replaceFirstWithEscape
              (__return_storage_ptr__,(string_t *)local_128,(string_t *)local_100);
    if ((string_t *)local_100._0_8_ != (string_t *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((string_t *)local_128._0_8_ != (string_t *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_);
    }
  }
  if ((pLVar5->m_flags & 2) != 0) {
    local_128._0_8_ = (string_t *)(local_128 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"%datetime","");
    pcVar4 = (pLVar5->m_dateTimeFormat)._M_dataplus._M_p;
    LVar2 = local_108->m_level;
    (*(this_00->super_ThreadSafe)._vptr_ThreadSafe[2])(this_00);
    format = TypedConfigurations::unsafeGetConfigByRef<el::base::SubsecondPrecision>
                       (this_00,LVar2,&this_00->m_subsecondPrecisionMap,"subsecondPrecision");
    gettimeofday((timeval *)&local_d8,(__timezone_ptr_t)0x0);
    tval.tv_usec = (__suseconds_t)pcVar4;
    tval.tv_sec = local_d8._M_string_length;
    utils::DateTime::timevalToString_abi_cxx11_
              ((string *)local_100,(DateTime *)local_d8._M_dataplus._M_p,tval,(char *)format,in_R9);
    utils::Str::replaceFirstWithEscape
              (__return_storage_ptr__,(string_t *)local_128,(string_t *)local_100);
    if ((string_t *)local_100._0_8_ != (string_t *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_);
    }
    if ((string_t *)local_128._0_8_ != (string_t *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_);
    }
  }
  if ((pLVar5->m_flags & 0x40) != 0) {
    local_128._0_8_ = (string_t *)(local_128 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"%func","");
    utils::Str::replaceFirstWithEscape
              (__return_storage_ptr__,(string_t *)local_128,(string_t *)&local_108->m_func);
    if ((string_t *)local_128._0_8_ != (string_t *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_);
    }
  }
  if ((pLVar5->m_flags & 8) != 0) {
    local_a8[0] = local_a8[0] & 0xffffffffffffff00;
    utils::File::buildStrippedFilename((local_108->m_file)._M_dataplus._M_p,(char *)local_a8,100);
    local_128._0_8_ = (string_t *)(local_128 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"%file","");
    local_100._0_8_ = (string_t *)(local_100 + 0x10);
    sVar8 = strlen((char *)local_a8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,local_a8,(long)local_a8 + sVar8);
    utils::Str::replaceFirstWithEscape
              (__return_storage_ptr__,(string_t *)local_128,(string_t *)local_100);
    if ((string_t *)local_100._0_8_ != (string_t *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_);
    }
    if ((string_t *)local_128._0_8_ != (string_t *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_);
    }
  }
  if ((pLVar5->m_flags & 0x4000) != 0) {
    local_a8[0] = local_a8[0] & 0xffffffffffffff00;
    utils::File::buildBaseFilename(&local_108->m_file,(char *)local_a8,100,"/");
    local_128._0_8_ = (string_t *)(local_128 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"%fbase","");
    local_100._0_8_ = (string_t *)(local_100 + 0x10);
    sVar8 = strlen((char *)local_a8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,local_a8,(long)local_a8 + sVar8);
    utils::Str::replaceFirstWithEscape
              (__return_storage_ptr__,(string_t *)local_128,(string_t *)local_100);
    if ((string_t *)local_100._0_8_ != (string_t *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_);
    }
    if ((string_t *)local_128._0_8_ != (string_t *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_);
    }
  }
  if ((pLVar5->m_flags & 0x10) != 0) {
    local_a8[0] = local_a8[0] & 0xffffffffffffff00;
    utils::Str::convertAndAddToBuff(local_108->m_line,10,(char *)local_a8,local_3a,false);
    local_128._0_8_ = (string_t *)(local_128 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"%line","");
    local_100._0_8_ = (string_t *)(local_100 + 0x10);
    sVar8 = strlen((char *)local_a8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,local_a8,(long)local_a8 + sVar8);
    utils::Str::replaceFirstWithEscape
              (__return_storage_ptr__,(string_t *)local_128,(string_t *)local_100);
    if ((string_t *)local_100._0_8_ != (string_t *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_);
    }
    if ((string_t *)local_128._0_8_ != (string_t *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_);
    }
  }
  if ((pLVar5->m_flags & 0x20) != 0) {
    local_a8[0] = local_a8[0] & 0xffffffffffffff00;
    utils::File::buildStrippedFilename((local_108->m_file)._M_dataplus._M_p,(char *)local_a8,100);
    uVar9 = 0;
    do {
      if (*(char *)((long)local_a8 + uVar9) == '\0') goto LAB_0011ab04;
      uVar9 = uVar9 + 1;
    } while (uVar9 != 0x6e);
    uVar9 = 0x6e;
LAB_0011ab04:
    if (uVar9 < 0x6e) {
      lVar10 = 0;
      do {
        *(char *)((long)local_a8 + lVar10 + uVar9) = ":"[lVar10];
        if (lVar10 == 1) break;
        lVar10 = lVar10 + 1;
      } while (0x6e - uVar9 != lVar10);
      buf = (char *)((long)local_a8 + lVar10 + uVar9);
    }
    else {
      buf = (char *)((long)local_a8 + uVar9);
    }
    utils::Str::convertAndAddToBuff(local_108->m_line,10,buf,local_3a,false);
    local_128._0_8_ = (string_t *)(local_128 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"%loc","");
    local_100._0_8_ = (string_t *)(local_100 + 0x10);
    sVar8 = strlen((char *)local_a8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,local_a8,(long)local_a8 + sVar8);
    utils::Str::replaceFirstWithEscape
              (__return_storage_ptr__,(string_t *)local_128,(string_t *)local_100);
    if ((string_t *)local_100._0_8_ != (string_t *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_);
    }
    if ((string_t *)local_128._0_8_ != (string_t *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_);
    }
  }
  if ((local_108->m_level == Verbose) && ((pLVar5->m_flags & 0x400) != 0)) {
    local_a8[0] = local_a8[0] & 0xffffffffffffff00;
    utils::Str::convertAndAddToBuff
              ((ulong)local_108->m_verboseLevel,1,(char *)local_a8,local_3a,false);
    local_128._0_8_ = (string_t *)(local_128 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"%vlevel","");
    local_100._0_8_ = (string_t *)(local_100 + 0x10);
    sVar8 = strlen((char *)local_a8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,local_a8,(long)local_a8 + sVar8);
    utils::Str::replaceFirstWithEscape
              (__return_storage_ptr__,(string_t *)local_128,(string_t *)local_100);
    if ((string_t *)local_100._0_8_ != (string_t *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_);
    }
    if ((string_t *)local_128._0_8_ != (string_t *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_);
    }
  }
  if ((pLVar5->m_flags & 0x200) != 0) {
    local_128._0_8_ = (string_t *)(local_128 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"%msg","");
    utils::Str::replaceFirstWithEscape
              (__return_storage_ptr__,(string_t *)local_128,&local_108->m_message);
    if ((string_t *)local_128._0_8_ != (string_t *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_);
    }
  }
  puVar12 = *(undefined8 **)(elStorage + 0x158);
  if (puVar12 != *(undefined8 **)(elStorage + 0x160)) {
    psVar1 = (string_t *)(local_100 + 0x10);
    do {
      std::__cxx11::string::string((string *)local_128,(char *)*puVar12,(allocator *)local_100);
      local_100._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((string *)local_100,local_128._0_8_,(pointer)(local_128._0_8_ + local_128._8_8_));
      local_b0 = local_108;
      if (puVar12[3] == 0) {
        uVar11 = std::__throw_bad_function_call();
        if ((string_t *)local_100._0_8_ != (string_t *)local_100) {
          operator_delete((void *)local_100._0_8_);
        }
        if ((string_t *)local_128._0_8_ != psVar1) {
          operator_delete((void *)local_128._0_8_);
        }
        pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != local_b8) {
          operator_delete(pcVar3);
        }
        _Unwind_Resume(uVar11);
      }
      (*(code *)puVar12[4])((string_t *)&local_d8,puVar12 + 1,&local_b0);
      utils::Str::replaceFirstWithEscape
                (__return_storage_ptr__,(string_t *)local_100,(string_t *)&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((string_t *)local_100._0_8_ != psVar1) {
        operator_delete((void *)local_100._0_8_);
      }
      if ((string_t *)local_128._0_8_ != (string_t *)(local_128 + 0x10)) {
        operator_delete((void *)local_128._0_8_);
      }
      puVar12 = puVar12 + 5;
    } while (puVar12 != *(undefined8 **)(elStorage + 0x160));
  }
  if ((char)local_dc != '\0') {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

base::type::string_t DefaultLogBuilder::build(const LogMessage* logMessage, bool appendNewLine) const {
  base::TypedConfigurations* tc = logMessage->logger()->typedConfigurations();
  const base::LogFormat* logFormat = &tc->logFormat(logMessage->level());
  base::type::string_t logLine = logFormat->format();
  char buff[base::consts::kSourceFilenameMaxLength + base::consts::kSourceLineMaxLength] = "";
  const char* bufLim = buff + sizeof(buff);
  if (logFormat->hasFlag(base::FormatFlags::AppName)) {
    // App name
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kAppNameFormatSpecifier,
        logMessage->logger()->parentApplicationName());
  }
  if (logFormat->hasFlag(base::FormatFlags::ThreadId)) {
    // Thread ID
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kThreadIdFormatSpecifier,
        ELPP->getThreadName(base::threading::getCurrentThreadId()));
  }
  if (logFormat->hasFlag(base::FormatFlags::DateTime)) {
    // DateTime
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kDateTimeFormatSpecifier,
        base::utils::DateTime::getDateTime(logFormat->dateTimeFormat().c_str(),
                                           &tc->subsecondPrecision(logMessage->level())));
  }
  if (logFormat->hasFlag(base::FormatFlags::Function)) {
    // Function
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogFunctionFormatSpecifier, logMessage->func());
  }
  if (logFormat->hasFlag(base::FormatFlags::File)) {
    // File
    base::utils::Str::clearBuff(buff, base::consts::kSourceFilenameMaxLength);
    base::utils::File::buildStrippedFilename(logMessage->file().c_str(), buff);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogFileFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::FileBase)) {
    // FileBase
    base::utils::Str::clearBuff(buff, base::consts::kSourceFilenameMaxLength);
    base::utils::File::buildBaseFilename(logMessage->file(), buff);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogFileBaseFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::Line)) {
    // Line
    char* buf = base::utils::Str::clearBuff(buff, base::consts::kSourceLineMaxLength);
    buf = base::utils::Str::convertAndAddToBuff(logMessage->line(), base::consts::kSourceLineMaxLength, buf, bufLim, false);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogLineFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::Location)) {
    // Location
    char* buf = base::utils::Str::clearBuff(buff,
                                            base::consts::kSourceFilenameMaxLength + base::consts::kSourceLineMaxLength);
    base::utils::File::buildStrippedFilename(logMessage->file().c_str(), buff);
    buf = base::utils::Str::addToBuff(buff, buf, bufLim);
    buf = base::utils::Str::addToBuff(":", buf, bufLim);
    buf = base::utils::Str::convertAndAddToBuff(logMessage->line(),  base::consts::kSourceLineMaxLength, buf, bufLim,
          false);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogLocationFormatSpecifier, std::string(buff));
  }
  if (logMessage->level() == Level::Verbose && logFormat->hasFlag(base::FormatFlags::VerboseLevel)) {
    // Verbose level
    char* buf = base::utils::Str::clearBuff(buff, 1);
    buf = base::utils::Str::convertAndAddToBuff(logMessage->verboseLevel(), 1, buf, bufLim, false);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kVerboseLevelFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::LogMessage)) {
    // Log message
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kMessageFormatSpecifier, logMessage->message());
  }
#if !defined(ELPP_DISABLE_CUSTOM_FORMAT_SPECIFIERS)
  el::base::threading::ScopedLock lock_(ELPP->customFormatSpecifiersLock());
  ELPP_UNUSED(lock_);
  for (std::vector<CustomFormatSpecifier>::const_iterator it = ELPP->customFormatSpecifiers()->begin();
       it != ELPP->customFormatSpecifiers()->end(); ++it) {
    std::string fs(it->formatSpecifier());
    base::type::string_t wcsFormatSpecifier(fs.begin(), fs.end());
    base::utils::Str::replaceFirstWithEscape(logLine, wcsFormatSpecifier, it->resolver()(logMessage));
  }
#endif  // !defined(ELPP_DISABLE_CUSTOM_FORMAT_SPECIFIERS)
  if (appendNewLine) logLine += ELPP_LITERAL("\n");
  return logLine;
}